

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O2

void printModel(char *filename)

{
  FILE *__s;
  ulong uVar1;
  int iVar2;
  
  __s = fopen(filename,"w");
  if (__s != (FILE *)0x0) {
    uVar1 = 1;
    fwrite("c Satisfiability model produced by sgen4\n",0x29,1,__s);
    fprintf(__s,"c %s\n",commandLine);
    fwrite("s SATISFIABLE\n",0xe,1,__s);
    while( true ) {
      if ((long)numOfVariables < (long)uVar1) break;
      iVar2 = (int)((uVar1 & 0xffffffff) / 0x14) * -0x14 + (int)uVar1;
      if (iVar2 == 1) {
        fwrite("v ",2,1,__s);
      }
      fprintf(__s,"%d ",(ulong)(uint)(model[uVar1] * globalPermute[uVar1]));
      if (iVar2 == 0) {
        fputc(10,__s);
      }
      uVar1 = uVar1 + 1;
    }
    if (numOfVariables % 0x14 == 0) {
      fwrite("v ",2,1,__s);
    }
    fwrite("0 \n",3,1,__s);
    fclose(__s);
    return;
  }
  fprintf(_stderr,"Unable to write model to file <%s>\n",filename);
  exit(0);
}

Assistant:

void printModel (char *filename)
{
    FILE *f;
    int v, varsPerLine;

    f = fopen (filename, "w");
    if (f != NULL)
    {
        fprintf (f, "c Satisfiability model produced by sgen4\n");
        fprintf (f, "c %s\n", commandLine);
        fprintf (f, "s SATISFIABLE\n");

        varsPerLine = 20;

        for (v=1;v<=numOfVariables;v++)
        {
            if ( v % varsPerLine == 1)
                fprintf (f, "v ");
            fprintf (f, "%d ", unPermuteVar(v)*model[v]);
            if (v % varsPerLine == 0)
                fprintf (f, "\n");
        }
        if (numOfVariables % varsPerLine == 0)
            fprintf (f, "v ");
        fprintf (f, "0 \n");
        fclose (f);
    }
    else
    {
        fprintf (stderr, "Unable to write model to file <%s>\n", filename);
        exit(0);
    }

}